

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O1

uint8_t * google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<3>
                    (EpsCopyOutputStream *stream,int64_t value,uint8_t *target)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  *target = '\x18';
  pbVar2 = target + 1;
  uVar3 = value;
  if (0x7f < (ulong)value) {
    do {
      *pbVar2 = (byte)uVar3 | 0x80;
      value = uVar3 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar3;
      uVar3 = value;
    } while (bVar1);
  }
  *pbVar2 = (byte)value;
  return pbVar2 + 1;
}

Assistant:

PROTOBUF_NOINLINE static uint8_t* WriteInt64ToArrayWithField(
      ::google::protobuf::io::EpsCopyOutputStream* stream, int64_t value,
      uint8_t* target) {
    target = stream->EnsureSpace(target);
    return WriteInt64ToArray(field_number, value, target);
  }